

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O1

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
::Unarchive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
            *this,MemIOReader *Reader)

{
  ulong uVar1;
  pointer *ppIVar2;
  int iVar3;
  iterator __position;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint unaff_R13D;
  bool bVar8;
  byte bVar9;
  value_type tmp_item;
  IndexEntry local_50;
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
  *local_38;
  
  uVar5 = (ulong)Reader->m_capacity;
  uVar7 = (ulong)Reader->m_size;
  uVar1 = uVar7 + 4;
  if (uVar1 <= uVar5) {
    uVar6 = *(uint *)(Reader->m_p + uVar7);
    unaff_R13D = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = Reader->m_size + 4;
    uVar7 = (ulong)uVar6;
    Reader->m_size = uVar6;
  }
  bVar9 = (byte)uVar7;
  if (uVar5 < uVar1) {
    bVar4 = false;
  }
  else {
    uVar6 = Reader->m_size;
    uVar1 = (ulong)uVar6 + 4;
    if (uVar1 <= uVar5) {
      iVar3 = *(int *)(Reader->m_p + uVar6);
      Reader->m_size = uVar6 + 4;
      bVar9 = iVar3 == 0xb000000;
    }
    bVar4 = false;
    if ((uVar1 <= uVar5) && (unaff_R13D == 0 || (bVar9 & 1) != 0)) {
      if (unaff_R13D == 0) {
        bVar4 = true;
      }
      else {
        local_38 = (vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
                    *)&this->
                       super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
        ;
        uVar6 = 1;
        do {
          local_50.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00224af0;
          local_50.TemporalOffset = '\0';
          local_50.KeyFrameOffset = '\0';
          local_50.Flags = 0x80;
          local_50.StreamOffset = 0;
          bVar4 = IndexTableSegment::IndexEntry::Unarchive(&local_50,Reader);
          if (bVar4) {
            __position._M_current =
                 (this->
                 super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                 ).
                 super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->
                super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                ).
                super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
              ::_M_realloc_insert<ASDCP::MXF::IndexTableSegment::IndexEntry_const&>
                        (local_38,__position,&local_50);
            }
            else {
              ((__position._M_current)->super_IArchive)._vptr_IArchive =
                   (_func_int **)&PTR__IArchive_00224af0;
              (__position._M_current)->TemporalOffset = local_50.TemporalOffset;
              (__position._M_current)->KeyFrameOffset = local_50.KeyFrameOffset;
              (__position._M_current)->Flags = local_50.Flags;
              *(undefined5 *)&(__position._M_current)->field_0xb = local_50._11_5_;
              (__position._M_current)->StreamOffset = local_50.StreamOffset;
              ppIVar2 = &(this->
                         super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                         ).
                         super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppIVar2 = *ppIVar2 + 1;
            }
          }
          bVar8 = uVar6 < unaff_R13D;
          uVar6 = uVar6 + 1;
        } while (bVar4 && bVar8);
      }
    }
  }
  return bVar4;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }